

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

HMODULE LOADRegisterLibraryDirect(void *dl_handle,LPCSTR libraryNameOrPath,BOOL fDynamic)

{
  BOOL BVar1;
  code *pcVar2;
  HINSTANCE pVVar3;
  undefined1 *lpReserved;
  BOOL dllMainRetVal;
  PREGISTER_MODULE registerModule;
  MODSTRUCT *module;
  BOOL fDynamic_local;
  LPCSTR libraryNameOrPath_local;
  void *dl_handle_local;
  
  registerModule = (PREGISTER_MODULE)LOADAddModule(dl_handle,libraryNameOrPath);
  if ((MODSTRUCT *)registerModule == (MODSTRUCT *)0x0) {
    dl_handle_local = (void *)0x0;
  }
  else {
    if (((MODSTRUCT *)registerModule)->pDllMain == (PDLLMAIN)0x0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if (((MODSTRUCT *)registerModule)->hinstance == (HINSTANCE)0x0) {
        pcVar2 = (code *)dlsym(((MODSTRUCT *)registerModule)->dl_handle,"PAL_RegisterModule");
        if (pcVar2 == (code *)0x0) {
          ((MODSTRUCT *)registerModule)->hinstance = registerModule;
        }
        else {
          pVVar3 = (HINSTANCE)(*pcVar2)(libraryNameOrPath);
          ((MODSTRUCT *)registerModule)->hinstance = pVVar3;
        }
      }
      lpReserved = &DAT_ffffffffffffffff;
      if (fDynamic != 0) {
        lpReserved = (undefined1 *)0x0;
      }
      BVar1 = LOADCallDllMainSafe((MODSTRUCT *)registerModule,1,lpReserved);
      if (BVar1 == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        ((MODSTRUCT *)registerModule)->pDllMain = (PDLLMAIN)0x0;
        FreeLibrary(registerModule);
        SetLastError(0x45a);
        registerModule = (PREGISTER_MODULE)0x0;
      }
    }
    dl_handle_local = registerModule;
  }
  return dl_handle_local;
}

Assistant:

static HMODULE LOADRegisterLibraryDirect(void *dl_handle, LPCSTR libraryNameOrPath, BOOL fDynamic)
{
    MODSTRUCT *module = LOADAddModule(dl_handle, libraryNameOrPath);
    if (module == nullptr)
    {
        return nullptr;
    }

    /* If the module contains a DllMain, call it. */
    if (module->pDllMain)
    {
        TRACE("Calling DllMain (%p) for module %S\n",
            module->pDllMain,
            module->lib_name ? module->lib_name : W16_NULLSTRING);

        if (nullptr == module->hinstance)
        {
            PREGISTER_MODULE registerModule = (PREGISTER_MODULE)dlsym(module->dl_handle, "PAL_RegisterModule");
            if (registerModule != nullptr)
            {
                module->hinstance = registerModule(libraryNameOrPath);
            }
            else
            {
                // If the target module doesn't have the PAL_RegisterModule export, then use this PAL's
                // module handle assuming that the target module is referencing this PAL's exported
                // functions on said handle.
                module->hinstance = (HINSTANCE)module;
            }
        }

        BOOL dllMainRetVal = LOADCallDllMainSafe(module, DLL_PROCESS_ATTACH, fDynamic ? nullptr : (LPVOID)-1);

        // If DlMain(DLL_PROCESS_ATTACH) returns FALSE, we must immediately unload the module
        if (!dllMainRetVal)
        {
            ERROR("DllMain returned FALSE; unloading module.\n");
            module->pDllMain = nullptr;
            FreeLibrary((HMODULE)module);
            SetLastError(ERROR_DLL_INIT_FAILED);
            module = nullptr;
        }
    }
    else
    {
        TRACE("Module does not contain a DllMain function.\n");
    }

    return module;
}